

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int write_to_temp(archive_write *a,void *buff,size_t s)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t ws;
  uchar *p;
  xar_conflict *xar;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  piVar2 = (int *)a->format_data;
  ws = (ssize_t)buff;
  xar = (xar_conflict *)s;
  while( true ) {
    if (xar == (xar_conflict *)0x0) {
      return 0;
    }
    sVar1 = write(*piVar2,(void *)ws,(size_t)xar);
    if (sVar1 < 0) break;
    xar = (xar_conflict *)((long)xar - sVar1);
    ws = sVar1 + ws;
    *(ssize_t *)(piVar2 + 2) = sVar1 + *(long *)(piVar2 + 2);
  }
  piVar2 = __errno_location();
  archive_set_error(&a->archive,*piVar2,"fwrite function failed");
  return -0x1e;
}

Assistant:

static int
write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	struct xar *xar;
	const unsigned char *p;
	ssize_t ws;

	xar = (struct xar *)a->format_data;
	p = (const unsigned char *)buff;
	while (s) {
		ws = write(xar->temp_fd, p, s);
		if (ws < 0) {
			archive_set_error(&(a->archive), errno,
			    "fwrite function failed");
			return (ARCHIVE_FATAL);
		}
		s -= ws;
		p += ws;
		xar->temp_offset += ws;
	}
	return (ARCHIVE_OK);
}